

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

void do_change_mode_proc(Am_Object *cmd)

{
  char cVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_String *pAVar4;
  Am_Value_List *pAVar5;
  Am_Gesture_Classifier cl;
  Am_String new_mode;
  Am_Gesture_Classifier aAStack_48 [8];
  Am_String local_40;
  Am_String local_38;
  Am_String local_30;
  Am_String local_28 [2];
  Am_Value_List local_18 [16];
  
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_String::Am_String(&local_30,pAVar2);
  cVar1 = Am_String::operator==(&local_30,&training_mode);
  if (cVar1 == '\0') {
    Am_Gesture_Trainer::Train();
    cVar1 = Am_Gesture_Classifier::Trained();
    if (cVar1 == '\0') {
      Am_Value_List::Am_Value_List((Am_Value_List *)local_28);
      Am_String::Am_String(&local_38,"This classifier can\'t recognize anything.",true);
      pAVar4 = (Am_String *)Am_Value_List::Add(local_28,(Am_Add_Position)&local_38,true);
      Am_String::Am_String(&local_40,"Please provide more examples.",true);
      pAVar5 = (Am_Value_List *)Am_Value_List::Add(pAVar4,(Am_Add_Position)&local_40,true);
      Am_Value_List::Am_Value_List(local_18,pAVar5);
      Popup_Error(local_18);
      Am_Value_List::~Am_Value_List(local_18);
      Am_String::~Am_String(&local_40);
      Am_String::~Am_String(&local_38);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_28);
      Am_Object::Set(0x560,(Am_String *)0x169,0x110570);
    }
    else {
      pAVar3 = Am_Gesture_Classifier::operator_cast_to_Am_Wrapper_(aAStack_48);
      Am_Object::Set(0x548,(Am_Wrapper *)0x140,(ulong)pAVar3);
    }
    Am_Gesture_Classifier::~Am_Gesture_Classifier(aAStack_48);
  }
  else {
    Am_Object::Set(0x548,0x140,0);
  }
  Am_String::~Am_String(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_change_mode, (Am_Object cmd))
{
  Am_String new_mode = cmd.Get(Am_VALUE);

  if (new_mode == training_mode) {
    gesture_inter.Set(Am_CLASSIFIER, 0);
  } else {
    Am_Gesture_Classifier cl = trainer.Train();

    if (!cl.Trained()) {
      Popup_Error(
          Am_Value_List()
              .Add(Am_String("This classifier can't recognize anything."))
              .Add(Am_String("Please provide more examples.")));
      // set the mode back
      mode.Set(Am_VALUE, training_mode);
    } else
      gesture_inter.Set(Am_CLASSIFIER, cl);
  }
}